

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::WriteSummary(cmGlobalGenerator *this,cmGeneratorTarget *target)

{
  cmSourceFile *this_00;
  long *plVar1;
  cmValue cVar2;
  cmMakefile *pcVar3;
  cmValue cVar4;
  cmValue cVar5;
  Value *pVVar6;
  string *psVar7;
  Value *pVVar8;
  ostream *poVar9;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  _Var10;
  pointer ppcVar11;
  string *c;
  pointer pbVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  String *pSVar14;
  string *label;
  pointer pbVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view arg;
  string_view arg_00;
  string_view arg_01;
  string_view arg_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  labels;
  string json_file;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmakeDirectoryLabelsList;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directoryLabelsList;
  string dir;
  string file;
  Value lj_root;
  cmGeneratedFileStream fout;
  cmGeneratedFileStream json_fout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_628;
  string *local_610;
  string local_608;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_5e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5a8;
  Value *local_588;
  string local_580;
  string local_560;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_540;
  Value local_528;
  ValueHolder local_500;
  pointer local_4f8;
  long local_4f0;
  char *local_4e8;
  ValueHolder local_298 [2];
  _Head_base<0UL,_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>_*,_false>
  local_288 [75];
  
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_(&local_580,target);
  local_500.string_ = (char *)local_580._M_string_length;
  local_4f8 = local_580._M_dataplus._M_p;
  local_4f0 = 0xb;
  local_4e8 = "/Labels.txt";
  views._M_len = 2;
  views._M_array = (iterator)&local_500;
  cmCatViews_abi_cxx11_(&local_560,views);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_608,local_580._M_dataplus._M_p,
             (char *)(local_580._M_string_length + (long)local_580._M_dataplus._M_p));
  std::__cxx11::string::append((char *)&local_608);
  local_500.string_ = (char *)&local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"LABELS","");
  cVar2 = cmGeneratorTarget::GetProperty(target,(string *)&local_500);
  if (local_500 != &local_4f0) {
    operator_delete(local_500.string_,local_4f0 + 1);
  }
  pcVar3 = cmTarget::GetMakefile(target->Target);
  local_500.string_ = (char *)&local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"LABELS","");
  cVar4 = cmMakefile::GetProperty(pcVar3,(string *)&local_500);
  if (local_500 != &local_4f0) {
    operator_delete(local_500.string_,local_4f0 + 1);
  }
  pcVar3 = cmTarget::GetMakefile(target->Target);
  local_500.string_ = (char *)&local_4f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"CMAKE_DIRECTORY_LABELS","");
  cVar5 = cmMakefile::GetDefinition(pcVar3,(string *)&local_500);
  if (local_500 != &local_4f0) {
    operator_delete(local_500.string_,local_4f0 + 1);
  }
  if ((cVar2.Value == (string *)0x0 && cVar4.Value == (string *)0x0) && cVar5.Value == (string *)0x0
     ) {
    cmsys::SystemTools::RemoveFile(&local_560);
    cmsys::SystemTools::RemoveFile(&local_608);
  }
  else {
    Json::Value::Value(&local_528,objectValue);
    Json::Value::Value((Value *)&local_500,objectValue);
    pVVar6 = Json::Value::operator[](&local_528,"target");
    pVVar6 = Json::Value::operator=(pVVar6,(Value *)&local_500);
    Json::Value::~Value((Value *)&local_500);
    psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(target);
    Json::Value::Value((Value *)&local_500,psVar7);
    pVVar8 = Json::Value::operator[](pVVar6,"name");
    Json::Value::operator=(pVVar8,(Value *)&local_500);
    Json::Value::~Value((Value *)&local_500);
    Json::Value::Value((Value *)&local_500,arrayValue);
    local_610 = cVar4.Value;
    pVVar6 = Json::Value::operator[](pVVar6,"labels");
    pVVar6 = Json::Value::operator=(pVVar6,(Value *)&local_500);
    Json::Value::~Value((Value *)&local_500);
    Json::Value::Value((Value *)&local_500,arrayValue);
    pVVar8 = Json::Value::operator[](&local_528,"sources");
    local_588 = Json::Value::operator=(pVVar8,(Value *)&local_500);
    Json::Value::~Value((Value *)&local_500);
    cmsys::SystemTools::MakeDirectory(&local_580,(mode_t *)0x0);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&local_500,&local_560,false,None);
    local_628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
    local_628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
    local_628.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (cVar2.Value != (string *)0x0) {
      arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
      arg._M_len = (cVar2.Value)->_M_string_length;
      cmExpandList(arg,&local_628,false);
      if (local_628.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_628.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_500,"# Target labels\n",0x10);
        pbVar12 = local_628.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (local_628.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_628.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar15 = local_628.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500," ",1);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_500,(pbVar15->_M_dataplus)._M_p,
                                pbVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            Json::Value::Value((Value *)local_298,pbVar15);
            Json::Value::append(pVVar6,(Value *)local_298);
            Json::Value::~Value((Value *)local_298);
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 != pbVar12);
        }
      }
    }
    local_5a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
    local_5a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
    local_5a8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (String *)0x0;
    local_5c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (String *)0x0;
    if (local_610 != (string *)0x0) {
      arg_00._M_str = (local_610->_M_dataplus)._M_p;
      arg_00._M_len = local_610->_M_string_length;
      cmExpandList(arg_00,&local_5a8,false);
    }
    if (cVar5.Value != (string *)0x0) {
      arg_01._M_str = ((cVar5.Value)->_M_dataplus)._M_p;
      arg_01._M_len = (cVar5.Value)->_M_string_length;
      cmExpandList(arg_01,&local_5c8,false);
    }
    if ((local_5a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_5a8.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) ||
       (local_5c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_5c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_500,"# Directory labels\n",0x13);
    }
    pbVar12 = local_5a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_5a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_5a8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = local_5a8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500," ",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_500,(pbVar15->_M_dataplus)._M_p,
                            pbVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        Json::Value::Value((Value *)local_298,pbVar15);
        Json::Value::append(pVVar6,(Value *)local_298);
        Json::Value::~Value((Value *)local_298);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar12);
    }
    pbVar12 = local_5c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_5c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_5c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar15 = local_5c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500," ",1);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_500,(pbVar15->_M_dataplus)._M_p,
                            pbVar15->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        Json::Value::Value((Value *)local_298,pbVar15);
        Json::Value::append(pVVar6,(Value *)local_298);
        Json::Value::~Value((Value *)local_298);
        pbVar15 = pbVar15 + 1;
      } while (pbVar15 != pbVar12);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_500,"# Source files and their labels\n",0x20);
    local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (cmSourceFile **)0x0;
    local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (cmSourceFile **)0x0;
    local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar3 = cmTarget::GetMakefile(target->Target);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_540,pcVar3,IncludeEmptyConfig);
    if (local_540.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_540.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar12 = local_540.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        cmGeneratorTarget::GetSourceFiles(target,&local_5e8,pbVar12);
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_540.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    _Var10 = cmRemoveDuplicates<__gnu_cxx::__normal_iterator<cmSourceFile**,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>>
                       ((__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         )local_5e8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                        (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                         )local_5e8.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish);
    if (local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != _Var10._M_current) {
      ppcVar11 = local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_610 = (string *)_Var10;
      do {
        this_00 = *ppcVar11;
        Json::Value::Value((Value *)local_298,objectValue);
        pVVar6 = Json::Value::append(local_588,(Value *)local_298);
        Json::Value::~Value((Value *)local_298);
        psVar7 = cmSourceFile::ResolveFullPath(this_00,(string *)0x0,(string *)0x0);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_500,(psVar7->_M_dataplus)._M_p,
                            psVar7->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
        Json::Value::Value((Value *)local_298,psVar7);
        pVVar8 = Json::Value::operator[](pVVar6,"file");
        Json::Value::operator=(pVVar8,(Value *)local_298);
        Json::Value::~Value((Value *)local_298);
        local_298[0].string_ = (char *)local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"LABELS","");
        cVar2 = cmSourceFile::GetProperty(this_00,(string *)local_298);
        if (local_298[0] != local_288) {
          operator_delete(local_298[0].string_,
                          (ulong)((long)&(local_288[0]._M_head_impl)->_M_elems[0]._M_dataplus._M_p +
                                 1));
        }
        pbVar15 = local_628.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pbVar12 = local_628.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (cVar2.Value != (string *)0x0) {
          if (local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_628.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar13 = &(local_628.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->field_2;
            do {
              plVar1 = (long *)(((String *)(paVar13 + -1))->_M_dataplus)._M_p;
              if (paVar13 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)plVar1) {
                operator_delete(plVar1,paVar13->_M_allocated_capacity + 1);
              }
              pSVar14 = (String *)(paVar13 + 1);
              paVar13 = paVar13 + 2;
            } while (pSVar14 != pbVar15);
            local_628.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
          }
          Json::Value::Value((Value *)local_298,arrayValue);
          pVVar6 = Json::Value::operator[](pVVar6,"labels");
          _Var10._M_current = (cmSourceFile **)local_610;
          pVVar6 = Json::Value::operator=(pVVar6,(Value *)local_298);
          Json::Value::~Value((Value *)local_298);
          arg_02._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
          arg_02._M_len = (cVar2.Value)->_M_string_length;
          cmExpandList(arg_02,&local_628,false);
          pbVar12 = local_628.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          for (pbVar15 = local_628.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start; pbVar15 != pbVar12;
              pbVar15 = pbVar15 + 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_500," ",1);
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_500,(pbVar15->_M_dataplus)._M_p,
                                pbVar15->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
            Json::Value::Value((Value *)local_298,pbVar15);
            Json::Value::append(pVVar6,(Value *)local_298);
            Json::Value::~Value((Value *)local_298);
          }
        }
        ppcVar11 = ppcVar11 + 1;
      } while (ppcVar11 != _Var10._M_current);
    }
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_608,false,None);
    Json::operator<<((OStream *)local_298,&local_528);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_540);
    if (local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (cmSourceFile **)0x0) {
      operator_delete(local_5e8.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_628);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&local_500);
    Json::Value::~Value(&local_528);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::WriteSummary(cmGeneratorTarget* target)
{
  // Place the labels file in a per-target support directory.
  std::string dir = target->GetSupportDirectory();
  std::string file = cmStrCat(dir, "/Labels.txt");
  std::string json_file = dir + "/Labels.json";

#ifndef CMAKE_BOOTSTRAP
  // Check whether labels are enabled for this target.
  cmValue targetLabels = target->GetProperty("LABELS");
  cmValue directoryLabels =
    target->Target->GetMakefile()->GetProperty("LABELS");
  cmValue cmakeDirectoryLabels =
    target->Target->GetMakefile()->GetDefinition("CMAKE_DIRECTORY_LABELS");
  if (targetLabels || directoryLabels || cmakeDirectoryLabels) {
    Json::Value lj_root(Json::objectValue);
    Json::Value& lj_target = lj_root["target"] = Json::objectValue;
    lj_target["name"] = target->GetName();
    Json::Value& lj_target_labels = lj_target["labels"] = Json::arrayValue;
    Json::Value& lj_sources = lj_root["sources"] = Json::arrayValue;

    cmSystemTools::MakeDirectory(dir);
    cmGeneratedFileStream fout(file);

    std::vector<std::string> labels;

    // List the target-wide labels.  All sources in the target get
    // these labels.
    if (targetLabels) {
      cmExpandList(*targetLabels, labels);
      if (!labels.empty()) {
        fout << "# Target labels\n";
        for (std::string const& l : labels) {
          fout << " " << l << "\n";
          lj_target_labels.append(l);
        }
      }
    }

    // List directory labels
    std::vector<std::string> directoryLabelsList;
    std::vector<std::string> cmakeDirectoryLabelsList;

    if (directoryLabels) {
      cmExpandList(*directoryLabels, directoryLabelsList);
    }

    if (cmakeDirectoryLabels) {
      cmExpandList(*cmakeDirectoryLabels, cmakeDirectoryLabelsList);
    }

    if (!directoryLabelsList.empty() || !cmakeDirectoryLabelsList.empty()) {
      fout << "# Directory labels\n";
    }

    for (std::string const& li : directoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    for (std::string const& li : cmakeDirectoryLabelsList) {
      fout << " " << li << "\n";
      lj_target_labels.append(li);
    }

    // List the source files with any per-source labels.
    fout << "# Source files and their labels\n";
    std::vector<cmSourceFile*> sources;
    std::vector<std::string> const& configs =
      target->Target->GetMakefile()->GetGeneratorConfigs(
        cmMakefile::IncludeEmptyConfig);
    for (std::string const& c : configs) {
      target->GetSourceFiles(sources, c);
    }
    auto const sourcesEnd = cmRemoveDuplicates(sources);
    for (cmSourceFile* sf : cmMakeRange(sources.cbegin(), sourcesEnd)) {
      Json::Value& lj_source = lj_sources.append(Json::objectValue);
      std::string const& sfp = sf->ResolveFullPath();
      fout << sfp << "\n";
      lj_source["file"] = sfp;
      if (cmValue svalue = sf->GetProperty("LABELS")) {
        labels.clear();
        Json::Value& lj_source_labels = lj_source["labels"] = Json::arrayValue;
        cmExpandList(*svalue, labels);
        for (std::string const& label : labels) {
          fout << " " << label << "\n";
          lj_source_labels.append(label);
        }
      }
    }
    cmGeneratedFileStream json_fout(json_file);
    json_fout << lj_root;
  } else
#endif
  {
    cmSystemTools::RemoveFile(file);
    cmSystemTools::RemoveFile(json_file);
  }
}